

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O3

RGB __thiscall
pbrt::MIPMap::EWA<pbrt::RGB>(MIPMap *this,int level,Point2f st,Vector2f dst0,Vector2f dst1)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined1 auVar3 [16];
  int iVar4;
  Point2i PVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 in_XMM1_Qb;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  undefined8 in_XMM2_Qb;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  float fVar18;
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  RGB RVar23;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float local_78;
  undefined1 auVar22 [64];
  
  iVar7 = (int)(this->pyramid).nStored;
  if (level < iVar7) {
    local_98._8_8_ = in_XMM0_Qb;
    local_98._0_8_ = st.super_Tuple2<pbrt::Point2,_float>;
    PVar5 = LevelResolution(this,level);
    auVar21 = ZEXT816(0) << 0x40;
    auVar22 = ZEXT1664(auVar21);
    auVar10._8_8_ = 0;
    auVar10._0_4_ = PVar5.super_Tuple2<pbrt::Point2,_int>.x;
    auVar10._4_4_ = PVar5.super_Tuple2<pbrt::Point2,_int>.y;
    auVar10 = vcvtdq2ps_avx(auVar10);
    local_a8 = dst1.super_Tuple2<pbrt::Vector2,_float>.x;
    fStack_a4 = dst1.super_Tuple2<pbrt::Vector2,_float>.y;
    fStack_a0 = (float)in_XMM2_Qb;
    fStack_9c = (float)((ulong)in_XMM2_Qb >> 0x20);
    auVar15._0_4_ = auVar10._0_4_ * local_a8;
    auVar15._4_4_ = auVar10._4_4_ * fStack_a4;
    auVar15._8_4_ = auVar10._8_4_ * fStack_a0;
    auVar15._12_4_ = auVar10._12_4_ * fStack_9c;
    auVar1 = vmovshdup_avx(auVar10);
    auVar9 = vmovshdup_avx(local_98);
    auVar3 = vfmadd213ss_fma(auVar1,auVar9,SUB6416(ZEXT464(0xbf000000),0));
    local_b8 = dst0.super_Tuple2<pbrt::Vector2,_float>.x;
    fStack_b4 = dst0.super_Tuple2<pbrt::Vector2,_float>.y;
    fStack_b0 = (float)in_XMM1_Qb;
    fStack_ac = (float)((ulong)in_XMM1_Qb >> 0x20);
    auVar12._0_4_ = auVar10._0_4_ * local_b8;
    auVar12._4_4_ = auVar10._4_4_ * fStack_b4;
    auVar12._8_4_ = auVar10._8_4_ * fStack_b0;
    auVar12._12_4_ = auVar10._12_4_ * fStack_ac;
    auVar1 = vmovshdup_avx(auVar15);
    auVar16._0_4_ = auVar15._0_4_ * auVar15._0_4_;
    auVar16._4_4_ = auVar15._4_4_ * auVar15._4_4_;
    auVar16._8_4_ = auVar15._8_4_ * auVar15._8_4_;
    auVar16._12_4_ = auVar15._12_4_ * auVar15._12_4_;
    auVar9 = vmovshdup_avx(auVar12);
    auVar16 = vfmadd231ps_fma(auVar16,auVar12,auVar12);
    auVar1 = vfmadd213ss_fma(auVar9,auVar12,ZEXT416((uint)(auVar15._0_4_ * auVar1._0_4_)));
    fVar2 = auVar1._0_4_ * -2.0;
    auVar1._8_4_ = 0x3f800000;
    auVar1._0_8_ = 0x3f8000003f800000;
    auVar1._12_4_ = 0x3f800000;
    auVar9 = vaddps_avx512vl(auVar16,auVar1);
    auVar1 = vmovshdup_avx(auVar9);
    auVar1 = vfmadd213ss_fma(auVar1,auVar9,ZEXT416((uint)(fVar2 * fVar2 * -0.25)));
    fVar13 = 1.0 / auVar1._0_4_;
    fVar2 = fVar2 * fVar13;
    auVar19._0_4_ = auVar9._0_4_ * fVar13;
    auVar19._4_4_ = auVar9._4_4_ * fVar13;
    auVar19._8_4_ = auVar9._8_4_ * fVar13;
    auVar19._12_4_ = auVar9._12_4_ * fVar13;
    auVar1 = vmovshdup_avx(auVar19);
    fVar20 = auVar1._0_4_;
    auVar1 = vfnmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ * fVar20 * 4.0)),ZEXT416((uint)fVar2),
                              ZEXT416((uint)fVar2));
    fVar14 = auVar1._0_4_;
    auVar1 = vmaxss_avx(ZEXT416((uint)(fVar20 * fVar14)),auVar21);
    auVar1 = vsqrtss_avx(auVar1,auVar1);
    fVar13 = 1.0 / fVar14 + 1.0 / fVar14;
    auVar16 = vfnmadd213ss_fma(auVar1,ZEXT416((uint)fVar13),auVar3);
    auVar9 = vfmadd213ss_fma(auVar1,ZEXT416((uint)fVar13),auVar3);
    auVar1 = vroundss_avx(auVar16,auVar16,10);
    auVar9 = vroundss_avx(auVar9,auVar9,9);
    auVar16 = ZEXT816(0) << 0x20;
    auVar17 = ZEXT864(0) << 0x20;
    if ((int)auVar9._0_4_ < (int)auVar1._0_4_) {
      fVar18 = 0.0;
    }
    else {
      auVar15 = vfmadd213ss_fma(auVar10,local_98,SUB6416(ZEXT464(0xbf000000),0));
      fVar18 = 0.0;
      auVar10 = vmaxss_avx(ZEXT416((uint)(auVar19._0_4_ * fVar14)),auVar21);
      auVar16 = vsqrtss_avx(auVar10,auVar10);
      auVar10 = vfnmadd213ss_fma(auVar16,ZEXT416((uint)fVar13),auVar15);
      auVar10 = vroundss_avx(auVar10,auVar10,10);
      auVar16 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar13),auVar15);
      auVar12 = vroundss_avx(auVar16,auVar16,9);
      iVar7 = (int)auVar1._0_4_;
      do {
        if ((int)auVar10._0_4_ <= (int)auVar12._0_4_) {
          local_78 = auVar3._0_4_;
          local_78 = (float)iVar7 - local_78;
          iVar6 = (int)auVar10._0_4_;
          do {
            fVar13 = (float)iVar6 - auVar15._0_4_;
            auVar1 = vfmadd231ss_fma(ZEXT416((uint)(local_78 * fVar2 * fVar13)),
                                     ZEXT416((uint)fVar13),ZEXT416((uint)(fVar20 * fVar13)));
            auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)(auVar19._0_4_ * local_78)),
                                     ZEXT416((uint)local_78));
            if (auVar1._0_4_ < 1.0) {
              uVar11 = 0;
              iVar4 = (int)(auVar1._0_4_ * 128.0);
              if (0x7e < iVar4) {
                iVar4 = 0x7f;
              }
              PVar5.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
              PVar5.super_Tuple2<pbrt::Point2,_int>.x = iVar6;
              RVar23 = Texel<pbrt::RGB>(this,level,PVar5);
              local_a8 = auVar17._0_4_;
              fStack_a4 = auVar17._4_4_;
              fStack_a0 = auVar17._8_4_;
              fStack_9c = auVar17._12_4_;
              local_98._0_4_ = auVar22._0_4_;
              fVar13 = *(float *)(MIPFilterLUT + (long)iVar4 * 4);
              fVar18 = fVar18 + fVar13;
              auVar17 = ZEXT1664(CONCAT412(fStack_9c + fVar13 * (float)((ulong)uVar11 >> 0x20),
                                           CONCAT48(fStack_a0 + fVar13 * (float)uVar11,
                                                    CONCAT44(fStack_a4 + fVar13 * RVar23.g,
                                                             local_a8 + fVar13 * RVar23.r))));
              auVar22 = ZEXT464((uint)((float)local_98._0_4_ + fVar13 * RVar23.b));
            }
            iVar6 = iVar6 + 1;
          } while ((int)auVar12._0_4_ + 1 != iVar6);
        }
        auVar16 = auVar17._0_16_;
        auVar21 = auVar22._0_16_;
        bVar8 = iVar7 != (int)auVar9._0_4_;
        iVar7 = iVar7 + 1;
      } while (bVar8);
    }
    auVar9._4_4_ = fVar18;
    auVar9._0_4_ = fVar18;
    auVar9._8_4_ = fVar18;
    auVar9._12_4_ = fVar18;
    RVar23.b = auVar21._0_4_ / fVar18;
    auVar10 = vdivps_avx(auVar16,auVar9);
    RVar23._0_8_ = auVar10._0_8_;
    return RVar23;
  }
  RVar23 = Texel<pbrt::RGB>(this,iVar7 + -1,(Point2i)0x0);
  return RVar23;
}

Assistant:

T MIPMap::EWA(int level, Point2f st, Vector2f dst0, Vector2f dst1) const {
    if (level >= Levels())
        return Texel<T>(Levels() - 1, {0, 0});
    // Convert EWA coordinates to appropriate scale for level
    Point2i levelRes = LevelResolution(level);
    st[0] = st[0] * levelRes[0] - 0.5f;
    st[1] = st[1] * levelRes[1] - 0.5f;
    dst0[0] *= levelRes[0];
    dst0[1] *= levelRes[1];
    dst1[0] *= levelRes[0];
    dst1[1] *= levelRes[1];

    // Find ellipse coefficients that bound EWA filter region
    Float A = dst0[1] * dst0[1] + dst1[1] * dst1[1] + 1;
    Float B = -2 * (dst0[0] * dst0[1] + dst1[0] * dst1[1]);
    Float C = dst0[0] * dst0[0] + dst1[0] * dst1[0] + 1;
    Float invF = 1 / (A * C - B * B * 0.25f);
    A *= invF;
    B *= invF;
    C *= invF;

    // Compute the ellipse's $(s,t)$ bounding box in texture space
    Float det = -B * B + 4 * A * C;
    Float invDet = 1 / det;
    Float uSqrt = SafeSqrt(det * C), vSqrt = SafeSqrt(A * det);
    int s0 = std::ceil(st[0] - 2 * invDet * uSqrt);
    int s1 = std::floor(st[0] + 2 * invDet * uSqrt);
    int t0 = std::ceil(st[1] - 2 * invDet * vSqrt);
    int t1 = std::floor(st[1] + 2 * invDet * vSqrt);

    // Scan over ellipse bound and evaluate quadratic equation to filter image
    T sum{};
    Float sumWts = 0;
    for (int it = t0; it <= t1; ++it) {
        Float tt = it - st[1];
        for (int is = s0; is <= s1; ++is) {
            Float ss = is - st[0];
            // Compute squared radius and filter texel if it is inside the ellipse
            Float r2 = A * ss * ss + B * ss * tt + C * tt * tt;
            if (r2 < 1) {
                int index = std::min<int>(r2 * MIPFilterLUTSize, MIPFilterLUTSize - 1);
                Float weight = MIPFilterLUT[index];
                sum += weight * Texel<T>(level, {is, it});
                sumWts += weight;
            }
        }
    }
    return sum / sumWts;
}